

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O0

void If_ManSetupCiCutSets(If_Man_t *p)

{
  int iVar1;
  void *pvVar2;
  If_Set_t *pIVar3;
  int local_1c;
  int i;
  If_Obj_t *pObj;
  If_Man_t *p_local;
  
  if (p->pMemCi != (If_Set_t *)0x0) {
    __assert_fail("p->pMemCi == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMan.c"
                  ,0x238,"void If_ManSetupCiCutSets(If_Man_t *)");
  }
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vCis), local_1c < iVar1; local_1c = local_1c + 1) {
    pvVar2 = Vec_PtrEntry(p->vCis,local_1c);
    If_ManSetupCutTriv(p,(If_Cut_t *)((long)pvVar2 + 0x50),*(int *)((long)pvVar2 + 4));
  }
  iVar1 = If_ManCiNum(p);
  pIVar3 = (If_Set_t *)malloc((long)iVar1 << 5);
  p->pMemCi = pIVar3;
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vCis), local_1c < iVar1; local_1c = local_1c + 1) {
    pvVar2 = Vec_PtrEntry(p->vCis,local_1c);
    *(long *)((long)pvVar2 + 0x48) = (long)p->pMemCi + (long)local_1c * 0x20;
    *(undefined2 *)(*(long *)((long)pvVar2 + 0x48) + 2) = 1;
    **(undefined2 **)((long)pvVar2 + 0x48) = (short)p->pPars->nCutsMax;
    *(long *)(*(long *)((long)pvVar2 + 0x48) + 0x10) = *(long *)((long)pvVar2 + 0x48) + 0x18;
    **(long **)(*(long *)((long)pvVar2 + 0x48) + 0x10) = (long)pvVar2 + 0x50;
  }
  return;
}

Assistant:

void If_ManSetupCiCutSets( If_Man_t * p )
{
    If_Obj_t * pObj;
    int i;
    assert( p->pMemCi == NULL );
    // create elementary cuts for the CIs
    If_ManForEachCi( p, pObj, i )
        If_ManSetupCutTriv( p, &pObj->CutBest, pObj->Id );
    // create elementary cutsets for the CIs
    p->pMemCi = (If_Set_t *)ABC_ALLOC( char, If_ManCiNum(p) * (sizeof(If_Set_t) + sizeof(void *)) );
    If_ManForEachCi( p, pObj, i )
    {
        pObj->pCutSet = (If_Set_t *)((char *)p->pMemCi + i * (sizeof(If_Set_t) + sizeof(void *)));
        pObj->pCutSet->nCuts = 1;
        pObj->pCutSet->nCutsMax = p->pPars->nCutsMax;
        pObj->pCutSet->ppCuts = (If_Cut_t **)(pObj->pCutSet + 1);
        pObj->pCutSet->ppCuts[0] = &pObj->CutBest;
    }
}